

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O0

DataFieldInfo * __thiscall ser::FieldsTable::Find(FieldsTable *this,string *fieldName)

{
  bool bVar1;
  SerializationException *this_00;
  pointer ppVar2;
  undefined1 local_a0 [8];
  SerializationException exception;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string msg;
  _Self local_20;
  iterator iter;
  string *fieldName_local;
  FieldsTable *this_local;
  
  iter._M_node = (_Base_ptr)fieldName;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
       ::find(&this->data_,fieldName);
  msg.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
       ::end(&this->data_);
  bVar1 = std::operator==(&local_20,(_Self *)((long)&msg.field_2 + 8));
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
             ::operator->(&local_20);
    return &ppVar2->second;
  }
  std::operator+(&local_68,"Error: field ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iter._M_node);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68," is not registered\n");
  std::__cxx11::string::~string((string *)&local_68);
  SerializationException::SerializationException((SerializationException *)local_a0);
  SerializationException::Init((SerializationException *)local_a0,(string *)local_48);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_a0);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

DataFieldInfo& FieldsTable::Find(const std::string& fieldName)
{
    const std::map<std::string, DataFieldInfo>::iterator iter = data_.find(fieldName);

    if (iter == data_.end())
    {
        // Field does not exist
        std::string msg = "Error: field " + fieldName + " is not registered\n";
        SerializationException exception;
        exception.Init(msg);
        throw exception;
    }

    return iter->second;
}